

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O2

void race_help(wchar_t i,void *db,region *l)

{
  _Bool _Var1;
  int iVar2;
  player_race *ppVar3;
  char *__s1;
  long lVar4;
  player_ability **pppVar5;
  uint uVar6;
  
  ppVar3 = player_id2race(i);
  if (ppVar3 != (player_race *)0x0) {
    text_out_hook = text_out_to_screen;
    text_out_indent = L'\x13';
    Term_gotoxy(L'\x13',L'\t');
    for (lVar4 = -6; lVar4 != 0; lVar4 = lVar4 + 2) {
      text_out_e("%s%+3d",*(undefined8 *)((long)stat_names_reduced + lVar4 * 4 + 0x18),
                 (ulong)*(uint *)((long)ppVar3->r_skills + lVar4 * 2 + -8));
      if (lVar4 + 7U < 5) {
        text_out_e("  %s%+3d",*(undefined8 *)((long)window_flag_desc + lVar4 * 4),
                   (ulong)*(uint *)((long)ppVar3->r_skills + lVar4 * 2 + 4));
      }
      text_out("\n");
    }
    text_out_e("\n");
    skill_help(ppVar3->r_skills,(int *)0x0,ppVar3->r_mhp,ppVar3->r_exp,ppVar3->infra);
    text_out_e("\n");
    pppVar5 = &player_abilities;
    uVar6 = 0;
LAB_001b0fad:
    pppVar5 = &((player_ability *)pppVar5)->next->next;
    if (((player_ability *)pppVar5 != (player_ability *)0x0) && (uVar6 < 3)) {
      __s1 = ((player_ability *)pppVar5)->type;
      iVar2 = strcmp(__s1,"object");
      if (iVar2 == 0) goto code_r0x001b0fd6;
      goto LAB_001b0ffe;
    }
    for (; uVar6 < 3; uVar6 = uVar6 + 1) {
      text_out_e("\n");
    }
    text_out_indent = L'\0';
  }
  return;
code_r0x001b0fd6:
  _Var1 = flag_has_dbg(ppVar3->flags,5,(uint)((player_ability *)pppVar5)->index,"r->flags",
                       "ability->index");
  if (_Var1) {
    __s1 = ((player_ability *)pppVar5)->type;
LAB_001b0ffe:
    iVar2 = strcmp(__s1,"player");
    if (iVar2 == 0) {
      _Var1 = flag_has_dbg(ppVar3->pflags,3,(uint)((player_ability *)pppVar5)->index,"r->pflags",
                           "ability->index");
      if (!_Var1) goto LAB_001b0fad;
      __s1 = ((player_ability *)pppVar5)->type;
    }
    iVar2 = strcmp(__s1,"element");
    if ((iVar2 != 0) ||
       (((player_ability *)pppVar5)->value ==
        (int)ppVar3->el_info[((player_ability *)pppVar5)->index].res_level)) {
      text_out_e("\n%s",((player_ability *)pppVar5)->name);
      uVar6 = uVar6 + 1;
    }
  }
  goto LAB_001b0fad;
}

Assistant:

static void race_help(int i, void *db, const region *l)
{
	int j;
	struct player_race *r = player_id2race(i);
	int len = (STAT_MAX + 1) / 2;

	struct player_ability *ability;
	int n_flags = 0;
	int flag_space = 3;

	if (!r) return;

	/* Output to the screen */
	text_out_hook = text_out_to_screen;
	
	/* Indent output */
	text_out_indent = RACE_AUX_COL;
	Term_gotoxy(RACE_AUX_COL, TABLE_ROW);

	for (j = 0; j < len; j++) {  
		const char *name = stat_names_reduced[j];
		int adj = r->r_adj[j];

		text_out_e("%s%+3d", name, adj);

		if (j * 2 + 1 < STAT_MAX) {
			name = stat_names_reduced[j + len];
			adj = r->r_adj[j + len];
			text_out_e("  %s%+3d", name, adj);
		}

		text_out("\n");
	}
	
	text_out_e("\n");
	skill_help(r->r_skills, NULL, r->r_mhp, r->r_exp, r->infra);
	text_out_e("\n");

	for (ability = player_abilities; ability; ability = ability->next) {
		if (n_flags >= flag_space) break;
		if (streq(ability->type, "object") &&
			!of_has(r->flags, ability->index)) {
			continue;
		} else if (streq(ability->type, "player") &&
				   !pf_has(r->pflags, ability->index)) {
			continue;
		} else if (streq(ability->type, "element") &&
				   (r->el_info[ability->index].res_level != ability->value)) {
			continue;
		}
		text_out_e("\n%s", ability->name);
		n_flags++;
	}

	while (n_flags < flag_space) {
		text_out_e("\n");
		n_flags++;
	}

	/* Reset text_out() indentation */
	text_out_indent = 0;
}